

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

void cuddCacheResize(DdManager *table)

{
  uint uVar1;
  DdCache *pDVar2;
  DdCache *__ptr;
  _func_void_long *p_Var3;
  uint uVar4;
  int iVar5;
  DdCache *pDVar6;
  DdCache *pDVar7;
  DdCache *pDVar8;
  double dVar9;
  DdNodePtr *mem;
  ptruint misalignment;
  DD_OOMFP saveHandler;
  int moved;
  double offset;
  uint oldslots;
  uint slots;
  int shift;
  int posn;
  int i;
  DdCache *old;
  DdCache *entry;
  DdCache *oldacache;
  DdCache *oldcache;
  DdCache *cache;
  DdManager *table_local;
  
  saveHandler._4_4_ = 0;
  pDVar2 = table->cache;
  __ptr = table->acache;
  uVar1 = table->cacheSlots;
  uVar4 = uVar1 * 2;
  table->cacheSlots = uVar4;
  p_Var3 = Extra_UtilMMoutOfMemory;
  Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
  pDVar6 = (DdCache *)malloc((ulong)(uVar4 + 2) * 0x28);
  table->acache = pDVar6;
  Extra_UtilMMoutOfMemory = p_Var3;
  if (pDVar6 == (DdCache *)0x0) {
    table->cacheSlots = uVar1;
    table->acache = __ptr;
    table->maxCacheHard = uVar1 - 1;
    table->cacheSlack = -(uVar1 + 1);
  }
  else {
    pDVar6 = (DdCache *)((long)&pDVar6->f + (0x20 - ((ulong)pDVar6 & 0x1f) & 0xfffffffffffffff8));
    table->cache = pDVar6;
    if (((ulong)table->cache & 0x1f) != 0) {
      __assert_fail("((ptruint) table->cache & (32 - 1)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddCache.c"
                    ,0x3da,"void cuddCacheResize(DdManager *)");
    }
    iVar5 = table->cacheShift + -1;
    table->cacheShift = iVar5;
    table->memused = (ulong)uVar1 * 0x28 + table->memused;
    table->cacheSlack = table->cacheSlack + uVar1 * -2;
    for (shift = 0; (uint)shift < uVar4; shift = shift + 1) {
      pDVar6[shift].data = (DdNode *)0x0;
      pDVar6[shift].h = 0;
    }
    for (shift = 0; (uint)shift < uVar1; shift = shift + 1) {
      pDVar7 = pDVar2 + shift;
      if (pDVar7->data != (DdNode *)0x0) {
        pDVar8 = pDVar6 + (int)(pDVar7->hash >> ((byte)iVar5 & 0x1f));
        pDVar8->f = pDVar7->f;
        pDVar8->g = pDVar7->g;
        pDVar8->h = pDVar7->h;
        pDVar8->data = pDVar7->data;
        pDVar8->hash = pDVar7->hash;
        saveHandler._4_4_ = saveHandler._4_4_ + 1;
      }
    }
    if (__ptr != (DdCache *)0x0) {
      free(__ptr);
    }
    dVar9 = (double)(int)((double)uVar4 * table->minHit + 1.0);
    table->totCacheMisses = (table->cacheMisses - dVar9) + table->totCacheMisses;
    table->cacheMisses = dVar9;
    table->totCachehits = table->cacheHits + table->totCachehits;
    table->cacheHits = 0.0;
    table->cacheLastInserts = table->cacheinserts - (double)saveHandler._4_4_;
  }
  return;
}

Assistant:

void
cuddCacheResize(
  DdManager * table)
{
    DdCache *cache, *oldcache, *oldacache, *entry, *old;
    int i;
    int posn, shift;
    unsigned int slots, oldslots;
    double offset;
    int moved = 0;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;
#ifndef DD_CACHE_PROFILE
    ptruint misalignment;
    DdNodePtr *mem;
#endif

    oldcache = table->cache;
    oldacache = table->acache;
    oldslots = table->cacheSlots;
    slots = table->cacheSlots = oldslots << 1;

#ifdef DD_VERBOSE
    (void) fprintf(table->err,"Resizing the cache from %d to %d entries\n",
                   oldslots, slots);
    (void) fprintf(table->err,
                   "\thits = %g\tmisses = %g\thit ratio = %5.3f\n",
                   table->cacheHits, table->cacheMisses,
                   table->cacheHits / (table->cacheHits + table->cacheMisses));
#endif

    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
//    table->acache = cache = ABC_ALLOC(DdCache,slots+1);
    table->acache = cache = ABC_ALLOC(DdCache,slots+2);
    MMoutOfMemory = saveHandler;
    /* If we fail to allocate the new table we just give up. */
    if (cache == NULL) {
#ifdef DD_VERBOSE
        (void) fprintf(table->err,"Resizing failed. Giving up.\n");
#endif
        table->cacheSlots = oldslots;
        table->acache = oldacache;
        /* Do not try to resize again. */
        table->maxCacheHard = oldslots - 1;
        table->cacheSlack = - (int) (oldslots + 1);
        return;
    }
    /* If the size of the cache entry is a power of 2, we want to
    ** enforce alignment to that power of two. This happens when
    ** DD_CACHE_PROFILE is not defined. */
#ifdef DD_CACHE_PROFILE
    table->cache = cache;
#else
    mem = (DdNodePtr *) cache;
//    misalignment = (ptruint) mem & (sizeof(DdCache) - 1);
//    mem += (sizeof(DdCache) - misalignment) / sizeof(DdNodePtr);
//    table->cache = cache = (DdCache *) mem;
//    assert(((ptruint) table->cache & (sizeof(DdCache) - 1)) == 0);
    misalignment = (ptruint) mem & (32 - 1);
    mem += (32 - misalignment) / sizeof(DdNodePtr);
    table->cache = cache = (DdCache *) mem;
    assert(((ptruint) table->cache & (32 - 1)) == 0);
#endif
    shift = --(table->cacheShift);
    table->memused += (slots - oldslots) * sizeof(DdCache);
    table->cacheSlack -= slots; /* need these many slots to double again */

    /* Clear new cache. */
    for (i = 0; (unsigned) i < slots; i++) {
        cache[i].data = NULL;
        cache[i].h = 0;
#ifdef DD_CACHE_PROFILE
        cache[i].count = 0;
#endif
    }

    /* Copy from old cache to new one. */
    for (i = 0; (unsigned) i < oldslots; i++) {
        old = &oldcache[i];
        if (old->data != NULL) {
//            posn = ddCHash2(old->h,old->f,old->g,shift);
            posn = old->hash >> shift;
            entry = &cache[posn];
            entry->f = old->f;
            entry->g = old->g;
            entry->h = old->h;
            entry->data = old->data;
#ifdef DD_CACHE_PROFILE
            entry->count = 1;
#endif
            entry->hash = old->hash;
            moved++;
        }
    }

    ABC_FREE(oldacache);

    /* Reinitialize measurements so as to avoid division by 0 and
    ** immediate resizing.
    */
    offset = (double) (int) (slots * table->minHit + 1);
    table->totCacheMisses += table->cacheMisses - offset;
    table->cacheMisses = offset;
    table->totCachehits += table->cacheHits;
    table->cacheHits = 0;
    table->cacheLastInserts = table->cacheinserts - (double) moved;

}